

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

void __thiscall
ON_Font::SetSimulated
          (ON_Font *this,bool bSimulatedWeight,bool bSimulatedStretch,bool bSimulatedStyle,
          bool bSimulatedOther)

{
  byte bVar1;
  byte bVar2;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  
  bVar1 = bSimulatedWeight * '\x02' | 4;
  if (CONCAT31(in_register_00000011,bSimulatedStretch) == 0) {
    bVar1 = bSimulatedWeight * '\x02';
  }
  bVar2 = bVar1 | 8;
  if (CONCAT31(in_register_00000009,bSimulatedStyle) == 0) {
    bVar2 = bVar1;
  }
  this->m_simulated = bVar2 | bSimulatedOther;
  return;
}

Assistant:

void ON_Font::SetSimulated(
  bool bSimulatedWeight,
  bool bSimulatedStretch,
  bool bSimulatedStyle,
  bool bSimulatedOther
)
{
  ON__UINT8 s = 0;
  if (bSimulatedWeight)
    s |= 2;
  if (bSimulatedStretch)
    s |= 4;
  if (bSimulatedStyle)
    s |= 8;
  if (bSimulatedOther)
    s |= 1;
  m_simulated = s;
}